

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FixedRate::deltaRuleWithMomentum
          (FixedRate *this,Array *var,Array *lastDelta,Array *grad)

{
  float fVar1;
  float fVar2;
  size_t __n;
  size_t sVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  size_t n;
  Array *grad_local;
  Array *lastDelta_local;
  Array *var_local;
  FixedRate *this_local;
  
  __n = std::valarray<float>::size(var);
  sVar3 = std::valarray<float>::size(lastDelta);
  if (sVar3 != __n) {
    std::valarray<float>::resize(lastDelta,__n,0.0);
  }
  fVar1 = this->momentum;
  pfVar4 = std::begin<float>(lastDelta);
  pfVar5 = std::end<float>(lastDelta);
  pfVar6 = std::begin<float>(lastDelta);
  pfVar7 = std::end<float>(lastDelta);
  internal::scale<float*>(fVar1,pfVar4,pfVar5,pfVar6,pfVar7);
  fVar1 = this->learningRate;
  pfVar4 = std::begin<float>(grad);
  pfVar5 = std::end<float>(grad);
  pfVar6 = std::begin<float>(lastDelta);
  pfVar7 = std::end<float>(lastDelta);
  internal::scaleAdd<float_const*,float*>(-fVar1,pfVar4,pfVar5,pfVar6,pfVar7);
  if ((this->weightDecay != 0.0) || (NAN(this->weightDecay))) {
    fVar1 = this->learningRate;
    fVar2 = this->weightDecay;
    pfVar4 = std::begin<float>(var);
    pfVar5 = std::end<float>(var);
    pfVar6 = std::begin<float>(lastDelta);
    pfVar7 = std::end<float>(lastDelta);
    internal::scaleAdd<float*,float*>(fVar1 * -2.0 * fVar2,pfVar4,pfVar5,pfVar6,pfVar7);
  }
  pfVar4 = std::begin<float>(lastDelta);
  pfVar5 = std::end<float>(lastDelta);
  pfVar6 = std::begin<float>(var);
  pfVar7 = std::end<float>(var);
  internal::scaleAdd<float*,float*>(1.0,pfVar4,pfVar5,pfVar6,pfVar7);
  return;
}

Assistant:

void deltaRuleWithMomentum(Array &var, Array &lastDelta, const Array &grad) {
        size_t n = var.size();
        if (lastDelta.size() != n) {
            lastDelta.resize(n, 0.0f);
        }
        // calculate updates: delta = momentum * delta - eta * grad
        //   lastDelta = momentum * lastDelta
        internal::scale(momentum,
                std::begin(lastDelta), std::end(lastDelta),
                std::begin(lastDelta), std::end(lastDelta));
        //   lastDelta = lastDelta - eta * grad
        internal::scaleAdd(-learningRate,
                std::begin(grad), std::end(grad),
                std::begin(lastDelta), std::end(lastDelta));
        // add weight decay: var = var - 2 * eta * lambda * var
        //   lastDelta = lastDelta - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(var), std::end(var),
                std::begin(lastDelta), std::end(lastDelta));
        }
        // update weights
        internal::scaleAdd(1.0,
                std::begin(lastDelta), std::end(lastDelta),
                std::begin(var), std::end(var));
    }